

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::Parser::parse(Parser *this,StyleSheet *styleSheet,CaseSensitivity nameCaseSensitivity)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  Symbol *pSVar5;
  bool bVar6;
  Symbol *pSVar7;
  long lVar8;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QLatin1StringView str_03;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str.m_data = "charset";
  str.m_size = 7;
  bVar1 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str);
  if (bVar1) {
    lVar2 = (this->symbols).d.size;
    iVar4 = this->index;
    if (iVar4 < lVar2) {
      pSVar5 = (this->symbols).d.ptr;
      pSVar7 = pSVar5 + iVar4;
      iVar3 = iVar4;
      do {
        if (((pSVar7->token != S) && (pSVar7->token != CDO)) && (pSVar7->token != CDC)) {
          iVar4 = iVar3 + 1;
          this->index = iVar4;
          if (pSVar7->token == STRING) {
            lVar8 = (long)iVar4;
            if (lVar8 < lVar2) {
              iVar4 = iVar3 + 2;
              this->index = iVar4;
              if (pSVar5[lVar8].token == SEMICOLON) goto LAB_005e1926;
            }
            this->errorIndex = iVar4;
            goto LAB_005e1a44;
          }
          break;
        }
        iVar4 = iVar3 + 1;
        this->index = iVar4;
        pSVar7 = pSVar7 + 1;
        iVar3 = iVar4;
      } while (iVar4 < lVar2);
    }
    this->errorIndex = iVar4;
  }
  else {
    pSVar5 = (this->symbols).d.ptr;
    lVar2 = (this->symbols).d.size;
    iVar4 = this->index;
LAB_005e1926:
    if (iVar4 < lVar2) {
      pSVar5 = pSVar5 + iVar4;
      do {
        iVar4 = iVar4 + 1;
        if (((pSVar5->token != S) && (pSVar5->token != CDO)) && (pSVar5->token != CDC)) break;
        this->index = iVar4;
        pSVar5 = pSVar5 + 1;
      } while (iVar4 < lVar2);
    }
    do {
      str_00.m_data = "import";
      str_00.m_size = 6;
      bVar1 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_00);
      if (!bVar1) {
        goto LAB_005e1a79;
      }
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar1 = parseImport(this,(ImportRule *)&local_78);
      if (bVar1) {
        QtPrivate::QMovableArrayOps<QCss::ImportRule>::emplace<QCss::ImportRule_const&>
                  ((QMovableArrayOps<QCss::ImportRule> *)&styleSheet->importRules,
                   (styleSheet->importRules).d.size,(ImportRule *)&local_78);
        QList<QCss::ImportRule>::end(&styleSheet->importRules);
        lVar2 = (this->symbols).d.size;
        iVar4 = this->index;
        if (iVar4 < lVar2) {
          pSVar5 = (this->symbols).d.ptr + iVar4;
          do {
            iVar4 = iVar4 + 1;
            if (((pSVar5->token != S) && (pSVar5->token != CDO)) && (pSVar5->token != CDC)) break;
            this->index = iVar4;
            pSVar5 = pSVar5 + 1;
          } while (iVar4 < lVar2);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer
                ((QArrayDataPointer<QString> *)&local_78.declarations);
      if (&(local_78.selectors.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_78.selectors.d.d)->super_QArrayData,2,0x10);
        }
      }
    } while (bVar1);
  }
LAB_005e1a44:
  bVar6 = false;
LAB_005e1d26:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
LAB_005e1a79:
  str_01.m_data = "media";
  str_01.m_size = 5;
  bVar1 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_01);
  if (bVar1) {
    local_78.declarations.d.ptr = (Declaration *)0x0;
    local_78.declarations.d.size = 0;
    local_78.selectors.d.size = 0;
    local_78.declarations.d.d = (Data *)0x0;
    local_78.selectors.d.d = (Data *)0x0;
    local_78.selectors.d.ptr = (Selector *)0x0;
    bVar1 = parseMedia(this,(MediaRule *)&local_78);
    if (!bVar1) {
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::StyleRule> *)&local_78.declarations);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
      goto LAB_005e1a44;
    }
    QtPrivate::QMovableArrayOps<QCss::MediaRule>::emplace<QCss::MediaRule_const&>
              ((QMovableArrayOps<QCss::MediaRule> *)&styleSheet->mediaRules,
               (styleSheet->mediaRules).d.size,(MediaRule *)&local_78);
    QList<QCss::MediaRule>::end(&styleSheet->mediaRules);
    QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
              ((QArrayDataPointer<QCss::StyleRule> *)&local_78.declarations);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_78);
  }
  else {
    str_02.m_data = "page";
    str_02.m_size = 4;
    bVar1 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_02);
    if (bVar1) {
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar1 = parsePage(this,(PageRule *)&local_78);
      if (bVar1) {
        QtPrivate::QMovableArrayOps<QCss::PageRule>::emplace<QCss::PageRule_const&>
                  ((QMovableArrayOps<QCss::PageRule> *)&styleSheet->pageRules,
                   (styleSheet->pageRules).d.size,(PageRule *)&local_78);
        QList<QCss::PageRule>::end(&styleSheet->pageRules);
      }
      QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
    }
    else {
      str_03.m_data = "keyframes";
      str_03.m_size = 9;
      bVar1 = testTokenAndEndsWith(this,ATKEYWORD_SYM,str_03);
      if (!bVar1) {
        bVar1 = testSimpleSelector(this);
        if (bVar1) {
          local_78.selectors.d.d = (Data *)0x0;
          local_78.selectors.d.ptr = (Selector *)0x0;
          local_78.selectors.d.size = 0;
          local_78.declarations.d.d = (Data *)0x0;
          local_78.declarations.d.ptr = (Declaration *)0x0;
          local_78.declarations.d.size = 0;
          local_78.order = 0;
          local_78._52_4_ = 0xaaaaaaaa;
          bVar1 = parseRuleset(this,&local_78);
          if (!bVar1) {
            QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
            QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                      ((QArrayDataPointer<QCss::Selector> *)&local_78);
            goto LAB_005e1a44;
          }
          QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                    ((QMovableArrayOps<QCss::StyleRule> *)styleSheet,(styleSheet->styleRules).d.size
                     ,&local_78);
          QList<QCss::StyleRule>::end(&styleSheet->styleRules);
          QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_78.declarations.d);
          QArrayDataPointer<QCss::Selector>::~QArrayDataPointer
                    ((QArrayDataPointer<QCss::Selector> *)&local_78);
        }
        else {
          iVar4 = this->index;
          if ((this->symbols).d.size <= (long)iVar4) goto LAB_005e1c11;
          if ((this->symbols).d.ptr[iVar4].token != ATKEYWORD_SYM) goto LAB_005e1a44;
          this->index = iVar4 + 1;
          bVar6 = false;
          bVar1 = until(this,RBRACE,NONE);
          if (!bVar1) goto LAB_005e1d26;
        }
        goto LAB_005e1c11;
      }
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      bVar1 = parseAnimation(this,(AnimationRule *)&local_78);
      if (bVar1) {
        QtPrivate::QMovableArrayOps<QCss::AnimationRule>::emplace<QCss::AnimationRule_const&>
                  ((QMovableArrayOps<QCss::AnimationRule> *)&styleSheet->animationRules,
                   (styleSheet->animationRules).d.size,(AnimationRule *)&local_78);
        QList<QCss::AnimationRule>::end(&styleSheet->animationRules);
      }
      QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet> *)&local_78.declarations)
      ;
    }
    if (&(local_78.selectors.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_78.selectors.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_78.selectors.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar1 == false) goto LAB_005e1a44;
  }
LAB_005e1c11:
  lVar2 = (this->symbols).d.size;
  iVar4 = this->index;
  if (lVar2 <= iVar4) goto LAB_005e1d15;
  pSVar5 = (this->symbols).d.ptr + iVar4;
  while (((iVar4 = iVar4 + 1, pSVar5->token == S || (pSVar5->token == CDO)) ||
         (pSVar5->token == CDC))) {
    this->index = iVar4;
    pSVar5 = pSVar5 + 1;
    if (lVar2 <= iVar4) goto LAB_005e1d15;
  }
  goto LAB_005e1a79;
LAB_005e1d15:
  StyleSheet::buildIndexes(styleSheet,nameCaseSensitivity);
  bVar6 = true;
  goto LAB_005e1d26;
}

Assistant:

bool Parser::parse(StyleSheet *styleSheet, Qt::CaseSensitivity nameCaseSensitivity)
{
    if (testTokenAndEndsWith(ATKEYWORD_SYM, "charset"_L1)) {
        while (test(S) || test(CDO) || test(CDC)) {}
        if (!next(STRING)) return false;
        if (!next(SEMICOLON)) return false;
    }

    while (test(S) || test(CDO) || test(CDC)) {}

    while (testImport()) {
        ImportRule rule;
        if (!parseImport(&rule)) return false;
        styleSheet->importRules.append(rule);
        while (test(S) || test(CDO) || test(CDC)) {}
    }

    do {
        if (testMedia()) {
            MediaRule rule;
            if (!parseMedia(&rule)) return false;
            styleSheet->mediaRules.append(rule);
        } else if (testPage()) {
            PageRule rule;
            if (!parsePage(&rule)) return false;
            styleSheet->pageRules.append(rule);
        } else if (testAnimation()) {
            AnimationRule rule;
            if (!parseAnimation(&rule)) return false;
            styleSheet->animationRules.append(rule);
        } else if (testRuleset()) {
            StyleRule rule;
            if (!parseRuleset(&rule)) return false;
            styleSheet->styleRules.append(rule);
        } else if (test(ATKEYWORD_SYM)) {
            if (!until(RBRACE)) return false;
        } else if (hasNext()) {
            return false;
        }
        while (test(S) || test(CDO) || test(CDC)) {}
    } while (hasNext());
    styleSheet->buildIndexes(nameCaseSensitivity);
    return true;
}